

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_UpdateModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_MODULE_UPDATE *moduleUpdate)

{
  LOGGER_LOG p_Var1;
  undefined1 local_78 [8];
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE deviceOrModuleUpdate;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_REGISTRY_MODULE_UPDATE *moduleUpdate_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if (registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_UpdateModule",0x7c3,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else if ((moduleUpdate == (IOTHUB_REGISTRY_MODULE_UPDATE *)0x0) ||
          (moduleUpdate->moduleId == (char *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_UpdateModule",0x7c8,1,"moduleId cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else if ((moduleUpdate->version < 1) || (1 < moduleUpdate->version)) {
    deviceOrModuleUpdate.managedBy = (char *)xlogging_get_log_function();
    if ((LOGGER_LOG)deviceOrModuleUpdate.managedBy != (LOGGER_LOG)0x0) {
      (*(code *)deviceOrModuleUpdate.managedBy)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                 ,"IoTHubRegistryManager_UpdateModule",0x7cd,1,
                 "moduleUpdate must have valid version");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
  }
  else {
    memset(local_78,0,0x40);
    local_78._0_4_ = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE;
    if (0 < moduleUpdate->version) {
      deviceOrModuleUpdate._0_8_ = moduleUpdate->deviceId;
      deviceOrModuleUpdate.deviceId = moduleUpdate->primaryKey;
      deviceOrModuleUpdate.primaryKey = moduleUpdate->secondaryKey;
      deviceOrModuleUpdate.secondaryKey._0_4_ = moduleUpdate->status;
      deviceOrModuleUpdate.secondaryKey._4_4_ = moduleUpdate->authMethod;
      deviceOrModuleUpdate._40_8_ = moduleUpdate->moduleId;
      deviceOrModuleUpdate.moduleId = moduleUpdate->managedBy;
    }
    l._4_4_ = IoTHubRegistryManager_UpdateDeviceOrModule
                        (registryManagerHandle,(IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE *)local_78);
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_UpdateModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_MODULE_UPDATE* moduleUpdate)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if (registryManagerHandle == NULL)
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((moduleUpdate == NULL) || (moduleUpdate->moduleId == NULL))
    {
        LogError("moduleId cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if (moduleUpdate->version < IOTHUB_REGISTRY_MODULE_UPDATE_VERSION_1 || moduleUpdate->version > IOTHUB_REGISTRY_MODULE_UPDATE_VERSION_LATEST)
    {
        LogError("moduleUpdate must have valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        IOTHUB_REGISTRY_DEVICE_OR_MODULE_UPDATE deviceOrModuleUpdate;
        memset(&deviceOrModuleUpdate, 0, sizeof(deviceOrModuleUpdate));

        //Convert to generic update struct
        deviceOrModuleUpdate.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE;
        if (moduleUpdate-> version >= IOTHUB_REGISTRY_MODULE_UPDATE_VERSION_1)
        {
            deviceOrModuleUpdate.deviceId = moduleUpdate->deviceId;
            deviceOrModuleUpdate.primaryKey = moduleUpdate->primaryKey;
            deviceOrModuleUpdate.secondaryKey = moduleUpdate->secondaryKey;
            deviceOrModuleUpdate.status = moduleUpdate->status;
            deviceOrModuleUpdate.authMethod = moduleUpdate->authMethod;
            deviceOrModuleUpdate.moduleId = moduleUpdate->moduleId;
            deviceOrModuleUpdate.managedBy = moduleUpdate->managedBy;
        }

        result = IoTHubRegistryManager_UpdateDeviceOrModule(registryManagerHandle, &deviceOrModuleUpdate);
    }

    return result;
}